

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::D3MF::XmlSerializer::parseColor(XmlSerializer *this,char *color,aiColor4D *diffuse)

{
  char *__nptr;
  ulong uVar1;
  undefined8 uVar2;
  undefined8 in_RAX;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  char comp [3];
  undefined8 uStack_28;
  
  if (color != (char *)0x0) {
    uStack_28 = in_RAX;
    sVar3 = strlen(color);
    if ((sVar3 == 9) || (sVar3 == 7)) {
      bVar5 = *color == '#';
      if (bVar5) {
        __nptr = (char *)((long)&uStack_28 + 4);
        uStack_28 = CONCAT26((short)(uStack_28 >> 0x30),
                             CONCAT15(color[2],CONCAT14(color[1],(int)uStack_28))) &
                    0xff00ffffffffffff;
        lVar4 = strtol(__nptr,(char **)0x0,0x10);
        uVar1 = uStack_28;
        diffuse->r = (float)lVar4 / 255.0;
        uStack_28._0_5_ = CONCAT14(color[3],(undefined4)uStack_28);
        uStack_28._6_2_ = SUB82(uVar1,6);
        uStack_28._0_6_ = CONCAT15(color[4],(undefined5)uStack_28);
        lVar4 = strtol(__nptr,(char **)0x0,0x10);
        uVar2 = uStack_28;
        diffuse->g = (float)lVar4 / 255.0;
        uStack_28._0_5_ = CONCAT14(color[5],(undefined4)uStack_28);
        uStack_28._6_2_ = SUB82(uVar2,6);
        uStack_28._0_6_ = CONCAT15(color[6],(undefined5)uStack_28);
        lVar4 = strtol(__nptr,(char **)0x0,0x10);
        uVar2 = uStack_28;
        diffuse->b = (float)lVar4 / 255.0;
        if (sVar3 != 7) {
          uStack_28._0_5_ = CONCAT14(color[7],(undefined4)uStack_28);
          uStack_28._6_2_ = SUB82(uVar2,6);
          uStack_28._0_6_ = CONCAT15(color[8],(undefined5)uStack_28);
          lVar4 = strtol((char *)((long)&uStack_28 + 4),(char **)0x0,0x10);
          diffuse->a = (float)lVar4 / 255.0;
        }
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
    return bVar5;
  }
  return false;
}

Assistant:

bool parseColor( const char *color, aiColor4D &diffuse ) {
        if ( nullptr == color ) {
            return false;
        }

        //format of the color string: #RRGGBBAA or #RRGGBB (3MF Core chapter 5.1.1)
        const size_t len( strlen( color ) );
        if ( 9 != len && 7 != len) {
            return false;
        }

        const char *buf( color );
        if ( '#' != *buf ) {
            return false;
        }
        ++buf;
        char comp[ 3 ] = { 0,0,'\0' };

        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.r = static_cast<ai_real>( strtol( comp, NULL, 16 ) ) / ai_real(255.0);


        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.g = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.b = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        if(7 == len)
            return true;
        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.a = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        return true;
    }